

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_conn.cc
# Opt level: O1

void __thiscall iqxmlrpc::Client_connection::Client_connection(Client_connection *this)

{
  pointer __s;
  
  this->_vptr_Client_connection = (_func_int **)&PTR__Client_connection_00189030;
  (this->preader).header_cache._M_dataplus._M_p = (pointer)&(this->preader).header_cache.field_2;
  (this->preader).header_cache._M_string_length = 0;
  (this->preader).header_cache.field_2._M_local_buf[0] = '\0';
  (this->preader).content_cache._M_dataplus._M_p = (pointer)&(this->preader).content_cache.field_2;
  (this->preader).content_cache._M_string_length = 0;
  (this->preader).content_cache.field_2._M_local_buf[0] = '\0';
  (this->preader).header = (Header *)0x0;
  (this->preader).ver_level_ = HTTP_CHECK_WEAK;
  (this->preader).constructed = false;
  (this->preader).pkt_max_sz = 0;
  (this->preader).total_sz = 0;
  (this->preader).continue_sent_ = false;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x10000);
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = __s;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x10000;
  memset(__s,0,0x10000);
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s + 0x10000;
  return;
}

Assistant:

Client_connection::Client_connection():
  read_buf_(65536, '\0')
{
}